

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall XipFile::renamefile(XipFile *this,string *romname,string *newname)

{
  iterator iVar1;
  
  clearromhdr(this);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
          ::find(&(this->_files)._M_t,romname);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
    XipEntry::renamefile(*(XipEntry **)(iVar1._M_node + 2),newname,this,&this->_mm);
    return;
  }
  printf("renamefile: %s not found\n",(romname->_M_dataplus)._M_p);
  return;
}

Assistant:

virtual void renamefile(const std::string&romname, const std::string&newname)
    {
        clearromhdr(); // need to rewrite romhdr because we alloc new mem for the name
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("renamefile: %s not found\n", romname.c_str());
            return;
        }
        fi->second->renamefile(newname, *this, _mm);
    }